

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::bump_variables(Internal *this)

{
  Internal *pIVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  uint *puVar2;
  Profile *in_RSI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int *lit;
  uint *puVar3;
  double s;
  double s_00;
  
  pIVar1 = this->internal;
  __last._M_current = (int *)in_RSI;
  if ((pIVar1->profiles).bump.level <= (pIVar1->opts).profile) {
    __last._M_current = (int *)&(pIVar1->profiles).bump;
    time(pIVar1,(time_t *)in_RSI);
    start_profiling(pIVar1,(Profile *)__last._M_current,s);
  }
  if ((this->opts).bumpreason != 0) {
    bump_also_all_reason_literals(this);
  }
  if (((this->opts).score == 0) || ((this->stable & 1U) == 0)) {
    __first._M_current =
         (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((ulong)(long)(this->opts).radixsortlim <
        (ulong)((long)__last._M_current - (long)__first._M_current >> 2)) {
      rsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,CaDiCaL::analyze_bumped_rank>
                (__first,__last,(analyze_bumped_rank)this);
    }
    else {
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::analyze_bumped_smaller>>
                (__first,__last,(_Iter_comp_iter<CaDiCaL::analyze_bumped_smaller>)this);
    }
  }
  puVar2 = (uint *)(this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar3 = (uint *)(this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    __last._M_current = (int *)(ulong)*puVar3;
    bump_variable(this,*puVar3);
  }
  if (((this->opts).score != 0) && ((this->stable & 1U) != 0)) {
    bump_variable_score_inc(this);
  }
  pIVar1 = this->internal;
  if ((pIVar1->opts).profile < (pIVar1->profiles).bump.level) {
    return;
  }
  time(pIVar1,(time_t *)__last._M_current);
  stop_profiling(pIVar1,&(pIVar1->profiles).bump,s_00);
  return;
}

Assistant:

void Internal::bump_variables () {

  assert (opts.bump);

  START (bump);

  if (opts.bumpreason)
    bump_also_all_reason_literals ();

  if (!use_scores ()) {

    // Variables are bumped in the order they are in the current decision
    // queue.  This maintains relative order between bumped variables in
    // the queue and seems to work best.  We also experimented with
    // focusing on variables of the last decision level, but results were
    // mixed.

    MSORT (opts.radixsortlim, analyzed.begin (), analyzed.end (),
           analyze_bumped_rank (this), analyze_bumped_smaller (this));
  }

  for (const auto &lit : analyzed)
    bump_variable (lit);

  if (use_scores ())
    bump_variable_score_inc ();

  STOP (bump);
}